

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkDupTransformMiter(Abc_Ntk_t *pNtk)

{
  Abc_Aig_t *pAVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int iVar7;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x26b,"Abc_Ntk_t *Abc_NtkDupTransformMiter(Abc_Ntk_t *)");
  }
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,pNtk->ntkFunc,1);
  iVar7 = pNtk->nBarBufs;
  pNtk_00->nConstrs = pNtk->nConstrs;
  pNtk_00->nBarBufs = iVar7;
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar3;
  pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
  pNtk_00->pSpec = pcVar3;
  Abc_NtkCleanCopy(pNtk);
  pAVar4 = Abc_AigConst1(pNtk_00);
  pAVar5 = Abc_AigConst1(pNtk);
  (pAVar5->field_6).pCopy = pAVar4;
  for (iVar7 = 0; iVar7 < pNtk->vPis->nSize; iVar7 = iVar7 + 1) {
    pAVar4 = Abc_NtkPi(pNtk,iVar7);
    Abc_NtkDupObj(pNtk_00,pAVar4,1);
  }
  for (iVar7 = 0; iVar7 < pNtk->vPos->nSize; iVar7 = iVar7 + 2) {
    pAVar4 = Abc_NtkPo(pNtk,iVar7);
    Abc_NtkDupObj(pNtk_00,pAVar4,1);
  }
  for (iVar7 = 0; iVar7 < pNtk->vBoxes->nSize; iVar7 = iVar7 + 1) {
    pAVar4 = Abc_NtkBox(pNtk,iVar7);
    Abc_NtkDupBox(pNtk_00,pAVar4,1);
  }
  for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar7);
    if (pAVar4 != (Abc_Obj_t *)0x0) {
      iVar2 = Abc_AigNodeIsAnd(pAVar4);
      if (iVar2 != 0) {
        pAVar1 = (Abc_Aig_t *)pNtk_00->pManFunc;
        pAVar5 = Abc_ObjChild0Copy(pAVar4);
        pAVar6 = Abc_ObjChild1Copy(pAVar4);
        pAVar5 = Abc_AigAnd(pAVar1,pAVar5,pAVar6);
        (pAVar4->field_6).pCopy = pAVar5;
      }
    }
  }
  for (iVar7 = 0; iVar7 < pNtk->vPos->nSize; iVar7 = iVar7 + 2) {
    pAVar4 = Abc_NtkPo(pNtk,iVar7);
    pAVar5 = Abc_NtkPo(pNtk,iVar7 + 1);
    pAVar1 = (Abc_Aig_t *)pNtk_00->pManFunc;
    pAVar6 = Abc_ObjChild0Copy(pAVar4);
    pAVar5 = Abc_ObjChild0Copy(pAVar5);
    pAVar5 = Abc_AigXor(pAVar1,pAVar6,pAVar5);
    Abc_ObjAddFanin((pAVar4->field_6).pCopy,pAVar5);
  }
  for (iVar7 = 0; iVar7 < pNtk->vBoxes->nSize; iVar7 = iVar7 + 1) {
    pAVar4 = Abc_NtkBox(pNtk,iVar7);
    if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) {
      pAVar4 = Abc_NtkBox(pNtk,iVar7);
      pAVar4 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
      pAVar5 = (pAVar4->field_6).pCopy;
      pAVar4 = Abc_ObjChild0Copy(pAVar4);
      Abc_ObjAddFanin(pAVar5,pAVar4);
    }
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
  if (pNtk->vPis->nSize != pNtk_00->vPis->nSize) {
    __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x28d,"Abc_Ntk_t *Abc_NtkDupTransformMiter(Abc_Ntk_t *)");
  }
  if (pNtk->vPos->nSize != pNtk_00->vPos->nSize * 2) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 2*Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x28e,"Abc_Ntk_t *Abc_NtkDupTransformMiter(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[8] == pNtk_00->nObjCounts[8]) {
    return pNtk_00;
  }
  __assert_fail("Abc_NtkLatchNum(pNtk) == Abc_NtkLatchNum(pNtkNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                ,0x28f,"Abc_Ntk_t *Abc_NtkDupTransformMiter(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDupTransformMiter( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pObj2, * pMiter;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    pNtkNew->nConstrs   = pNtk->nConstrs;
    pNtkNew->nBarBufs   = pNtk->nBarBufs;
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
     Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 ), i++;
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, 1 );
    // copy the AND gates
    Abc_AigForEachAnd( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // create new miters
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pObj2 = Abc_NtkPo( pNtk, ++i );
        pMiter = Abc_AigXor( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild0Copy(pObj2) );
        Abc_ObjAddFanin( pObj->pCopy, pMiter );
    }
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
    // cleanup
    Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );
    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtk) == 2*Abc_NtkPoNum(pNtkNew) );
    assert( Abc_NtkLatchNum(pNtk) == Abc_NtkLatchNum(pNtkNew) );
    return pNtkNew;
}